

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall Am_Slot_Data::Destroy(Am_Slot_Data *this)

{
  Am_Object_Data *pAVar1;
  Am_Slot local_28;
  Am_Slot local_20;
  Am_Slot local_18;
  Am_Slot_Data *local_10;
  Am_Slot_Data *this_local;
  
  local_10 = this;
  if ((this->queued_demons != 0) && (this->context != (Am_Object_Data *)0x0)) {
    pAVar1 = this->context;
    Am_Slot::Am_Slot(&local_18,this);
    Am_Demon_Queue::Delete(&pAVar1->demon_queue,&local_18);
  }
  this->context = (Am_Object_Data *)0x0;
  if ((*(ushort *)&this->field_0x38 & 8) == 0) {
    Am_Slot::Am_Slot(&local_20,this);
    am_CList::destroy(&this->dependencies,&local_20,false);
    Am_Slot::Am_Slot(&local_28,this);
    am_CList::destroy(&this->constraints,&local_28,true);
    if (this != (Am_Slot_Data *)0x0) {
      ~Am_Slot_Data(this);
      operator_delete(this,0x40);
    }
  }
  return;
}

Assistant:

void
Am_Slot_Data::Destroy()
{
#ifdef DEBUG
  Global_Reason_Why_Set = Am_TRACE_SLOT_DESTROY;
  Global_Call_Slot_Trace(this);
#endif
  if (queued_demons && context)
    context->demon_queue.Delete(this);
  context = nullptr;
  if (!(flags & BIT_VALIDATING_NOW)) {
    dependencies.destroy(this, false);
    constraints.destroy(this, true);
    delete this;
  }
}